

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

size_t intersect_accel<false,false,true>(Ray *ray,Accel *accel,TraversalStats *stats)

{
  Vec<float,_3UL> *pVVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Index IVar5;
  pointer pNVar6;
  pointer pPVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  Index IVar12;
  long lVar13;
  size_t sVar14;
  uint uVar15;
  size_t i;
  ulong uVar16;
  ulong uVar17;
  Index IVar18;
  Index IVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> stack;
  undefined8 local_1f0;
  float local_1e8;
  ulong local_1e0;
  size_t local_1d8;
  Accel *local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  TraversalStats *local_190;
  Vec<float,_3UL> *local_188;
  size_t local_180;
  float local_178;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  Type local_134 [64];
  uint local_34;
  
  auVar29._8_4_ = 0x7fffffff;
  auVar29._0_8_ = 0x7fffffff7fffffff;
  auVar29._12_4_ = 0x7fffffff;
  local_188 = &ray->dir;
  fVar4 = (ray->dir).values[0];
  auVar8 = vpand_avx(ZEXT416((uint)fVar4),auVar29);
  auVar35._8_4_ = 0x7f7fffff;
  auVar35._0_8_ = &DAT_7f7fffff7f7fffff;
  auVar35._12_4_ = 0x7f7fffff;
  auVar33._8_4_ = 0x80000000;
  auVar33._0_8_ = 0x8000000080000000;
  auVar33._12_4_ = 0x80000000;
  auVar25 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)fVar4),auVar33,0xf8);
  auVar34 = SUB6416(ZEXT464(0x34000000),0);
  uVar9 = vcmpss_avx512f(auVar8,auVar34,6);
  bVar10 = (bool)((byte)uVar9 & 1);
  local_158._4_12_ = auVar25._4_12_;
  local_158._0_4_ = (float)((uint)bVar10 * (int)(1.0 / fVar4) + (uint)!bVar10 * auVar25._0_4_);
  auVar39 = ZEXT1664(local_158);
  fVar4 = (ray->dir).values[1];
  auVar8 = vpand_avx(ZEXT416((uint)fVar4),auVar29);
  auVar25 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)fVar4),auVar33,0xf8);
  uVar9 = vcmpss_avx512f(auVar8,auVar34,6);
  bVar10 = (bool)((byte)uVar9 & 1);
  local_168._4_12_ = auVar25._4_12_;
  local_168._0_4_ = (float)((uint)bVar10 * (int)(1.0 / fVar4) + (uint)!bVar10 * auVar25._0_4_);
  auVar41 = ZEXT1664(local_168);
  fVar4 = (ray->dir).values[2];
  auVar8 = vpand_avx(ZEXT416((uint)fVar4),auVar29);
  auVar25 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)fVar4),auVar33,0xf8);
  uVar9 = vcmpss_avx512f(auVar8,auVar34,6);
  bVar10 = (bool)((byte)uVar9 & 1);
  local_148._4_12_ = auVar25._4_12_;
  local_148._0_4_ = (float)((uint)bVar10 * (int)(1.0 / fVar4) + (uint)!bVar10 * auVar25._0_4_);
  auVar37 = ZEXT1664(local_148);
  fVar26 = -local_158._0_4_;
  fVar30 = -local_168._0_4_;
  fVar31 = -local_148._0_4_;
  fVar4 = (ray->org).values[0];
  fVar2 = (ray->org).values[1];
  fVar3 = (ray->org).values[2];
  iVar11 = (int)(ray->dir).values[0] >> 0x1f;
  uVar15 = -((int)(ray->dir).values[2] >> 0x1f);
  uVar20 = -((int)(ray->dir).values[1] >> 0x1f);
  local_134[0] = (((accel->bvh).nodes.
                   super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->index).value;
  uVar24 = (ulong)(uint)(iVar11 * -4);
  local_34 = 1;
  local_1d8 = 0xffffffffffffffff;
  uVar23 = (ulong)((uVar20 + 2) * 4);
  uVar22 = (ulong)((uVar15 + 4) * 4);
  uVar17 = (ulong)((-iVar11 ^ 1U) << 2);
  uVar21 = (ulong)((uVar20 ^ 3) << 2);
  uVar16 = (ulong)((uVar15 ^ 5) << 2);
  local_1e0 = uVar17;
  local_1d0 = accel;
  local_1b8 = uVar24;
  local_1b0 = uVar22;
  local_1a8 = uVar23;
  local_1a0 = uVar16;
  local_198 = uVar21;
  local_190 = stats;
  do {
    local_34 = local_34 - 1;
    IVar19.value = local_134[local_34];
    pNVar6 = (local_1d0->bvh).nodes.
             super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fVar28 = ray->tmin;
    fVar27 = ray->tmax;
    sVar14 = stats->visited_nodes;
    while( true ) {
      sVar14 = sVar14 + 1;
      uVar15 = IVar19.value >> 4;
      if ((IVar19.value & 0xf) != 0) break;
      stats->visited_nodes = sVar14;
      auVar38 = auVar39._0_16_;
      auVar42 = ZEXT416((uint)(fVar26 * fVar4));
      auVar8 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar15) + uVar24)),auVar42,auVar38)
      ;
      auVar40 = auVar41._0_16_;
      auVar43 = ZEXT416((uint)(fVar30 * fVar2));
      auVar25 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar15) + uVar23)),auVar43,auVar40
                               );
      auVar36 = auVar37._0_16_;
      auVar44 = ZEXT416((uint)(fVar31 * fVar3));
      auVar29 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar15) + uVar22)),auVar44,auVar36
                               );
      auVar33 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar15) + uVar17)),auVar42,auVar38
                               );
      auVar34 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar15) + uVar21)),auVar43,auVar40
                               );
      auVar35 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar15) + uVar16)),auVar44,auVar36
                               );
      auVar8 = vmaxss_avx(auVar8,ZEXT416((uint)fVar28));
      auVar8 = vmaxss_avx(auVar25,auVar8);
      auVar8 = vmaxss_avx(auVar29,auVar8);
      auVar25 = vminss_avx(auVar33,ZEXT416((uint)fVar27));
      auVar25 = vminss_avx(auVar34,auVar25);
      auVar29 = vminss_avx(auVar35,auVar25);
      auVar25 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar15 + 1) + uVar24)),
                                auVar42,auVar38);
      auVar33 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar15 + 1) + uVar23)),
                                auVar43,auVar40);
      auVar34 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar15 + 1) + uVar22)),
                                auVar44,auVar36);
      auVar35 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar15 + 1) + uVar17)),
                                auVar42,auVar38);
      auVar38 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar15 + 1) + uVar21)),
                                auVar43,auVar40);
      auVar36 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar15 + 1) + uVar16)),
                                auVar44,auVar36);
      auVar25 = vmaxss_avx(auVar25,ZEXT416((uint)fVar28));
      auVar25 = vmaxss_avx(auVar33,auVar25);
      auVar25 = vmaxss_avx(auVar34,auVar25);
      auVar33 = vminss_avx(auVar35,ZEXT416((uint)fVar27));
      auVar33 = vminss_avx(auVar38,auVar33);
      auVar33 = vminss_avx(auVar36,auVar33);
      fVar32 = auVar25._0_4_;
      if (auVar8._0_4_ <= auVar29._0_4_) {
        IVar19.value = ((Index *)((long)(pNVar6 + uVar15) + 0x18))->value;
        bVar10 = true;
        if (fVar32 <= auVar33._0_4_) {
          uVar17 = (ulong)local_34;
          if (0x3f < uVar17) {
            __assert_fail("!is_full()",
                          "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/stack.h"
                          ,0x15,
                          "void bvh::v2::SmallStack<bvh::v2::Index<32, 4>, 64>::push(const T &) [T = bvh::v2::Index<32, 4>, Capacity = 64]"
                         );
          }
          IVar5.value = ((Index *)((long)(pNVar6 + (ulong)uVar15 + 1) + 0x18))->value;
          IVar12.value = IVar5.value;
          IVar18.value = IVar19.value;
          if (auVar8._0_4_ <= fVar32) {
            IVar12.value = IVar19.value;
            IVar18.value = IVar5.value;
          }
          IVar19.value = IVar12.value;
          local_34 = local_34 + 1;
          local_134[uVar17] = IVar18.value;
          uVar17 = local_1e0;
        }
      }
      else if (auVar33._0_4_ < fVar32) {
        bVar10 = false;
      }
      else {
        IVar19.value = ((Index *)((long)(pNVar6 + (ulong)uVar15 + 1) + 0x18))->value;
        bVar10 = true;
      }
      if (!bVar10) goto joined_r0x00106897;
    }
    stats->visited_leaves = stats->visited_leaves + 1;
    uVar17 = (ulong)uVar15;
    do {
      sVar14 = (local_1d0->bvh).prim_ids.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      pPVar7 = (local_1d0->tris).
               super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar1 = &pPVar7[sVar14].n;
      auVar8 = vinsertps_avx(ZEXT416((uint)((((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values[0]
                                           - (ray->org).values[0])),
                             ZEXT416((uint)((((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values[1]
                                           - (ray->org).values[1])),0x10);
      local_1e8 = (((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values[2] - (ray->org).values[2];
      uVar9 = vmovlps_avx(auVar8);
      fVar28 = (ray->dir).values[0];
      fVar27 = (ray->dir).values[1];
      fVar32 = (ray->dir).values[2];
      local_1f0._0_4_ = (float)uVar9;
      local_1f0._4_4_ = (float)((ulong)uVar9 >> 0x20);
      auVar8 = vfmsub231ss_fma(ZEXT416((uint)(local_1f0._4_4_ * fVar32)),ZEXT416((uint)fVar27),
                               ZEXT416((uint)local_1e8));
      auVar25 = vfmsub231ss_fma(ZEXT416((uint)(local_1e8 * fVar28)),ZEXT416((uint)(float)local_1f0),
                                ZEXT416((uint)fVar32));
      auVar8 = vinsertps_avx(auVar8,auVar25,0x10);
      auVar25 = vfmsub231ss_fma(ZEXT416((uint)((float)local_1f0 * fVar27)),ZEXT416((uint)fVar28),
                                ZEXT416((uint)local_1f0._4_4_));
      local_1c8 = vmovlps_avx(auVar8);
      local_1c0 = auVar25._0_4_;
      local_1f0 = uVar9;
      local_180 = sVar14;
      fVar27 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,pVVar1,pPVar7 + sVar14 + 1,local_188);
      fVar28 = 0.0;
      lVar13 = 0;
      do {
        fVar28 = fVar28 + *(float *)((long)&local_1c8 + lVar13) *
                          *(float *)((long)pPVar7[sVar14].e2.values + lVar13);
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0xc);
      fVar32 = 0.0;
      lVar13 = 0;
      do {
        fVar32 = fVar32 + *(float *)((long)&local_1c8 + lVar13) *
                          *(float *)((long)pPVar7[sVar14].e1.values + lVar13);
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0xc);
      fVar27 = 1.0 / fVar27;
      uVar24 = 0;
      if (((-1.1920929e-07 <= fVar27 * fVar28) && (-1.1920929e-07 <= fVar27 * fVar32)) &&
         (-1.1920929e-07 <= (1.0 - fVar27 * fVar28) - fVar27 * fVar32)) {
        fVar28 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,pVVar1,pPVar7 + sVar14 + 1,&local_1f0);
        fVar28 = fVar28 * fVar27;
        uVar24 = vcmpps_avx512vl(ZEXT416((uint)ray->tmin),ZEXT416((uint)fVar28),2);
        uVar22 = vcmpps_avx512vl(ZEXT416((uint)fVar28),ZEXT416((uint)ray->tmax),2);
        uVar24 = uVar24 & uVar22;
        local_178 = (float)((uint)((byte)uVar24 & 1) * (int)fVar28 +
                           (uint)!(bool)((byte)uVar24 & 1) * (int)local_178);
      }
      if ((uVar24 & 1) != 0) {
        ray->tmax = local_178;
        local_1d8 = local_180;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != (IVar19.value & 0xf) + uVar15);
    auVar37 = ZEXT1664(local_148);
    auVar39 = ZEXT1664(local_158);
    auVar41 = ZEXT1664(local_168);
    uVar17 = local_1e0;
    uVar24 = local_1b8;
    uVar22 = local_1b0;
    uVar23 = local_1a8;
    uVar16 = local_1a0;
    uVar21 = local_198;
    stats = local_190;
joined_r0x00106897:
    if (local_34 == 0) {
      return local_1d8;
    }
  } while( true );
}

Assistant:

static size_t intersect_accel(Ray& ray, const Accel& accel, TraversalStats& stats) {
    size_t prim_id = invalid_id;
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    accel.bvh.intersect<false, UseRobustTraversal>(ray, accel.bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            if constexpr (CaptureStats)
                stats.visited_leaves++;
            for (size_t i = begin; i < end; ++i) {
                size_t j = PermutePrims ? i : accel.bvh.prim_ids[i];
                if (auto hit = accel.tris[j].intersect(ray)) {
                    ray.tmax = std::get<0>(*hit);
                    prim_id = j;
                }
            }
            return prim_id != invalid_id;
        },
        [&] (auto&&, auto&&) {
            if constexpr (CaptureStats)
                stats.visited_nodes++;
        });
    return prim_id;
}